

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O0

FT_Error TT_Load_Composite_Glyph(TT_Loader loader)

{
  byte *pbVar1;
  FT_GlyphLoader loader_00;
  FT_Error FVar2;
  FT_SubGlyph pFVar3;
  byte *pbVar4;
  FT_ULong FVar5;
  FT_Byte *pFVar6;
  FT_Stream stream;
  long lStack_60;
  FT_UInt count;
  FT_Fixed yx;
  FT_Fixed yy;
  FT_Fixed xy;
  FT_Fixed xx;
  FT_UInt num_subglyphs;
  FT_SubGlyph subglyph;
  FT_GlyphLoader gloader;
  FT_Byte *limit;
  FT_Byte *p;
  FT_Error error;
  TT_Loader loader_local;
  
  limit = loader->cursor;
  pbVar1 = loader->limit;
  loader_00 = loader->gloader;
  xx._4_4_ = 0;
  do {
    FVar2 = FT_GlyphLoader_CheckSubGlyphs(loader_00,xx._4_4_ + 1);
    if (FVar2 != 0) {
      return FVar2;
    }
    if (pbVar1 < limit + 4) {
      return 0x15;
    }
    pFVar3 = (loader_00->current).subglyphs + xx._4_4_;
    pFVar3->arg2 = 0;
    pFVar3->arg1 = 0;
    pFVar3->flags = CONCAT11(*limit,limit[1]);
    pbVar4 = limit + 4;
    pFVar3->index = (uint)CONCAT11(limit[2],limit[3]);
    stream._4_4_ = 2;
    if ((pFVar3->flags & 1) != 0) {
      stream._4_4_ = 4;
    }
    if ((pFVar3->flags & 8) == 0) {
      if ((pFVar3->flags & 0x40) == 0) {
        if ((pFVar3->flags & 0x80) != 0) {
          stream._4_4_ = stream._4_4_ + 8;
        }
      }
      else {
        stream._4_4_ = stream._4_4_ + 4;
      }
    }
    else {
      stream._4_4_ = stream._4_4_ + 2;
    }
    if (pbVar1 < pbVar4 + stream._4_4_) {
      return 0x15;
    }
    if ((pFVar3->flags & 2) == 0) {
      if ((pFVar3->flags & 1) == 0) {
        pFVar3->arg1 = (uint)*pbVar4;
        pFVar3->arg2 = (uint)limit[5];
        limit = limit + 6;
      }
      else {
        pFVar3->arg1 = (uint)CONCAT11(limit[4],limit[5]);
        pFVar3->arg2 = (uint)CONCAT11(limit[6],limit[7]);
        limit = limit + 8;
      }
    }
    else if ((pFVar3->flags & 1) == 0) {
      pFVar6 = limit + 5;
      pFVar3->arg1 = (int)(char)*pbVar4;
      limit = limit + 6;
      pFVar3->arg2 = (int)(char)*pFVar6;
    }
    else {
      pFVar3->arg1 = (int)CONCAT11(limit[4],limit[5]);
      pFVar3->arg2 = (int)CONCAT11(limit[6],limit[7]);
      limit = limit + 8;
    }
    yx = 0x10000;
    xy = 0x10000;
    lStack_60 = 0;
    yy = 0;
    if ((pFVar3->flags & 8) == 0) {
      if ((pFVar3->flags & 0x40) == 0) {
        if ((pFVar3->flags & 0x80) != 0) {
          xy = (long)CONCAT11(*limit,limit[1]) << 2;
          lStack_60 = (long)CONCAT11(limit[2],limit[3]) << 2;
          yy = (long)CONCAT11(limit[4],limit[5]) << 2;
          yx = (long)CONCAT11(limit[6],limit[7]) << 2;
          limit = limit + 8;
        }
      }
      else {
        xy = (long)CONCAT11(*limit,limit[1]) << 2;
        yx = (long)CONCAT11(limit[2],limit[3]) << 2;
        limit = limit + 4;
      }
    }
    else {
      yx = (long)CONCAT11(*limit,limit[1]) << 2;
      xy = yx;
      limit = limit + 2;
    }
    (pFVar3->transform).xx = xy;
    (pFVar3->transform).xy = yy;
    (pFVar3->transform).yx = lStack_60;
    (pFVar3->transform).yy = yx;
    xx._4_4_ = xx._4_4_ + 1;
  } while ((pFVar3->flags & 0x20) != 0);
  (loader_00->current).num_subglyphs = xx._4_4_;
  FVar5 = FT_Stream_Pos(loader->stream);
  loader->ins_pos = (FT_ULong)(limit + (FVar5 - (long)pbVar1));
  loader->cursor = limit;
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  TT_Load_Composite_Glyph( TT_Loader  loader )
  {
    FT_Error        error;
    FT_Byte*        p       = loader->cursor;
    FT_Byte*        limit   = loader->limit;
    FT_GlyphLoader  gloader = loader->gloader;
    FT_SubGlyph     subglyph;
    FT_UInt         num_subglyphs;


    num_subglyphs = 0;

    do
    {
      FT_Fixed  xx, xy, yy, yx;
      FT_UInt   count;


      /* check that we can load a new subglyph */
      error = FT_GlyphLoader_CheckSubGlyphs( gloader, num_subglyphs + 1 );
      if ( error )
        goto Fail;

      /* check space */
      if ( p + 4 > limit )
        goto Invalid_Composite;

      subglyph = gloader->current.subglyphs + num_subglyphs;

      subglyph->arg1 = subglyph->arg2 = 0;

      subglyph->flags = FT_NEXT_USHORT( p );
      subglyph->index = FT_NEXT_USHORT( p );

      /* check space */
      count = 2;
      if ( subglyph->flags & ARGS_ARE_WORDS )
        count += 2;
      if ( subglyph->flags & WE_HAVE_A_SCALE )
        count += 2;
      else if ( subglyph->flags & WE_HAVE_AN_XY_SCALE )
        count += 4;
      else if ( subglyph->flags & WE_HAVE_A_2X2 )
        count += 8;

      if ( p + count > limit )
        goto Invalid_Composite;

      /* read arguments */
      if ( subglyph->flags & ARGS_ARE_XY_VALUES )
      {
        if ( subglyph->flags & ARGS_ARE_WORDS )
        {
          subglyph->arg1 = FT_NEXT_SHORT( p );
          subglyph->arg2 = FT_NEXT_SHORT( p );
        }
        else
        {
          subglyph->arg1 = FT_NEXT_CHAR( p );
          subglyph->arg2 = FT_NEXT_CHAR( p );
        }
      }
      else
      {
        if ( subglyph->flags & ARGS_ARE_WORDS )
        {
          subglyph->arg1 = (FT_Int)FT_NEXT_USHORT( p );
          subglyph->arg2 = (FT_Int)FT_NEXT_USHORT( p );
        }
        else
        {
          subglyph->arg1 = (FT_Int)FT_NEXT_BYTE( p );
          subglyph->arg2 = (FT_Int)FT_NEXT_BYTE( p );
        }
      }

      /* read transform */
      xx = yy = 0x10000L;
      xy = yx = 0;

      if ( subglyph->flags & WE_HAVE_A_SCALE )
      {
        xx = (FT_Fixed)FT_NEXT_SHORT( p ) * 4;
        yy = xx;
      }
      else if ( subglyph->flags & WE_HAVE_AN_XY_SCALE )
      {
        xx = (FT_Fixed)FT_NEXT_SHORT( p ) * 4;
        yy = (FT_Fixed)FT_NEXT_SHORT( p ) * 4;
      }
      else if ( subglyph->flags & WE_HAVE_A_2X2 )
      {
        xx = (FT_Fixed)FT_NEXT_SHORT( p ) * 4;
        yx = (FT_Fixed)FT_NEXT_SHORT( p ) * 4;
        xy = (FT_Fixed)FT_NEXT_SHORT( p ) * 4;
        yy = (FT_Fixed)FT_NEXT_SHORT( p ) * 4;
      }

      subglyph->transform.xx = xx;
      subglyph->transform.xy = xy;
      subglyph->transform.yx = yx;
      subglyph->transform.yy = yy;

      num_subglyphs++;

    } while ( subglyph->flags & MORE_COMPONENTS );

    gloader->current.num_subglyphs = num_subglyphs;
    FT_TRACE5(( "  %d component%s\n",
                num_subglyphs,
                num_subglyphs > 1 ? "s" : "" ));

#ifdef FT_DEBUG_LEVEL_TRACE
    {
      FT_UInt  i;


      subglyph = gloader->current.subglyphs;

      for ( i = 0; i < num_subglyphs; i++ )
      {
        if ( num_subglyphs > 1 )
          FT_TRACE7(( "    subglyph %d:\n", i ));

        FT_TRACE7(( "      glyph index: %d\n", subglyph->index ));

        if ( subglyph->flags & ARGS_ARE_XY_VALUES )
          FT_TRACE7(( "      offset: x=%d, y=%d\n",
                      subglyph->arg1,
                      subglyph->arg2 ));
        else
          FT_TRACE7(( "      matching points: base=%d, component=%d\n",
                      subglyph->arg1,
                      subglyph->arg2 ));

        if ( subglyph->flags & WE_HAVE_A_SCALE )
          FT_TRACE7(( "      scaling: %f\n",
                      subglyph->transform.xx / 65536.0 ));
        else if ( subglyph->flags & WE_HAVE_AN_XY_SCALE )
          FT_TRACE7(( "      scaling: x=%f, y=%f\n",
                      subglyph->transform.xx / 65536.0,
                      subglyph->transform.yy / 65536.0 ));
        else if ( subglyph->flags & WE_HAVE_A_2X2 )
          FT_TRACE7(( "      scaling: xx=%f, yx=%f\n"
                      "               xy=%f, yy=%f\n",
                      subglyph->transform.xx / 65536.0,
                      subglyph->transform.yx / 65536.0,
                      subglyph->transform.xy / 65536.0,
                      subglyph->transform.yy / 65536.0 ));

        subglyph++;
      }
    }
#endif /* FT_DEBUG_LEVEL_TRACE */

#ifdef TT_USE_BYTECODE_INTERPRETER

    {
      FT_Stream  stream = loader->stream;


      /* we must undo the FT_FRAME_ENTER in order to point */
      /* to the composite instructions, if we find some.   */
      /* We will process them later.                       */
      /*                                                   */
      loader->ins_pos = (FT_ULong)( FT_STREAM_POS() +
                                    p - limit );
    }

#endif

    loader->cursor = p;

  Fail:
    return error;

  Invalid_Composite:
    error = FT_THROW( Invalid_Composite );
    goto Fail;
  }